

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::anon_unknown_15::ConsoleReporter::file_line_to_stream
          (ConsoleReporter *this,char *file,int line,char *tail)

{
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  ulong uVar4;
  
  poVar3 = this->s;
  Color::operator<<(poVar3,LightGrey);
  pcVar1 = skipPathFromFilename(file);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar1,sVar2);
  }
  pcVar1 = "(";
  if (this->opt->gnu_file_line != false) {
    pcVar1 = ":";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar1,1);
  if (this->opt->no_line_numbers != false) {
    line = 0;
  }
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,line);
  uVar4 = (ulong)this->opt->gnu_file_line;
  pcVar1 = "):";
  if (uVar4 != 0) {
    pcVar1 = ":";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar1,2 - uVar4);
  if (tail != (char *)0x0) {
    sVar2 = strlen(tail);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,tail,sVar2);
    return;
  }
  std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
  return;
}

Assistant:

virtual void file_line_to_stream(const char* file, int line,
                                        const char* tail = "") {
            s << Color::LightGrey << skipPathFromFilename(file) << (opt.gnu_file_line ? ":" : "(")
            << (opt.no_line_numbers ? 0 : line) // 0 or the real num depending on the option
            << (opt.gnu_file_line ? ":" : "):") << tail;
        }